

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void dumpBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool inArray)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  size_t j_1;
  ulong uVar5;
  ulong uVar6;
  size_t j_3;
  ulong uVar7;
  size_t j;
  long lVar8;
  ulong uVar9;
  
  uVar3 = (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar9 = 0;
  while( true ) {
    if (uVar3 < uVar9 + 8) break;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      printf("%02hhx ",
             (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar8 + uVar9]);
    }
    if (inArray) {
      putchar(0x20);
    }
    putchar(0x3c);
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      bVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8 + uVar9];
      iVar2 = isgraph((uint)bVar1);
      uVar4 = (uint)bVar1;
      if (iVar2 == 0) {
        uVar4 = 0x2e;
      }
      putchar(uVar4);
    }
    puts(">");
    uVar9 = uVar9 + 8;
  }
  uVar7 = uVar3 - uVar9;
  uVar5 = uVar9;
  if (uVar7 == 0) {
    return;
  }
  for (; uVar6 = uVar7, uVar3 != uVar5; uVar5 = uVar5 + 1) {
    printf("%02hhx ",
           (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar5]);
  }
  for (; uVar6 < 8; uVar6 = uVar6 + 1) {
    printf("   ");
  }
  if (inArray) {
    putchar(0x20);
  }
  putchar(0x3c);
  for (; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    uVar4 = (uint)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar9];
    iVar2 = isgraph(uVar4);
    if (iVar2 == 0) {
      uVar4 = 0x2e;
    }
    putchar(uVar4);
  }
  for (; uVar7 < 8; uVar7 = uVar7 + 1) {
    putchar(0x20);
  }
  puts(">");
  return;
}

Assistant:

void dumpBytes(const std::vector<uint8_t>& value, bool inArray = false)
{
	size_t len = value.size();
	size_t i = 0;
	while (i + 8 <= len)
	{
		for (size_t j = 0; j < 8; j++)
		{
			printf("%02hhx ", value[i + j]);
		}
		if (inArray)
		{
			printf(" ");
		}
		printf("<");
		for (size_t j = 0; j < 8; j++)
		{
			uint8_t c = value[i + j];
			if (isgraph((int) c) == 0)
			{
				printf(".");
			}
			else
			{
				printf("%c", (int) c);
			}
		}
		printf(">\n");
		i += 8;
	}
	len -= i;
	if (len == 0)
	{
		return;
	}

	for (size_t j = 0; j < len; j++)
	{
		printf("%02hhx ", value[i + j]);
	}
	for (size_t j = len; j < 8; j++)
	{
		printf("   ");
	}
	if (inArray)
	{
		printf(" ");
	}
	printf("<");
	for (size_t j = 0; j < len; j++)
	{
		uint8_t c = value[i + j];
		if (isgraph((int) c) == 0)
		{
			printf(".");
		}
		else
		{
			printf("%c", (int) c);
		}
	}
	for (size_t j =len; j < 8; j++)
	{
		printf(" ");
	}
	printf(">\n");
}